

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test::testBody
          (TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  undefined4 extraout_var_01;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  undefined8 local_20;
  void *objectPtr2;
  void *objectPtr1;
  TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test *this_local;
  
  objectPtr2 = (void *)0x1;
  local_20 = 2;
  objectPtr1 = this;
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_50,"boo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_50);
  SimpleString::~SimpleString(local_50);
  SimpleString::~SimpleString(&local_30);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_70);
  SimpleString::SimpleString(&local_80,"p");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
            ((long *)CONCAT44(extraout_var,iVar1),&local_80,1);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a0);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x170))
                             ((long *)CONCAT44(extraout_var_00,iVar1),local_20);
  SimpleString::SimpleString(&local_b0,"p");
  (**(code **)(*plVar3 + 0x38))(plVar3,&local_b0,1);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_c0,"");
  pMVar2 = mock(&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d0,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_d0);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x170))
            ((long *)CONCAT44(extraout_var_01,iVar1),objectPtr2);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  return;
}

Assistant:

TEST(MockCallTest, OnObjectIgnored_InitialMatchDiscarded)
{
    void* objectPtr1 = (void*) 0x001;
    void* objectPtr2 = (void*) 0x002;

    mock().expectOneCall("boo");
    mock().expectOneCall("boo").withBoolParameter("p", true);
    mock().actualCall("boo").onObject(objectPtr2).withBoolParameter("p", true);
    mock().actualCall("boo").onObject(objectPtr1);
}